

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_SINCDEC_v(DisasContext_conflict1 *s,arg_incdec2_cnt *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  TCGv_i64 val;
  TCGv_i64 t;
  int inc;
  uint numelem;
  uint fullsz;
  TCGContext_conflict1 *tcg_ctx;
  arg_incdec2_cnt *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (a->esz == 0) {
    s_local._7_1_ = false;
  }
  else {
    uVar2 = vec_full_reg_size(s);
    uVar2 = decode_pred_count(uVar2,a->pat,a->esz);
    iVar3 = uVar2 * a->imm;
    if (iVar3 == 0) {
      do_mov_z(s,a->rd,a->rn);
    }
    else {
      _Var1 = sve_access_check_aarch64(s);
      if (_Var1) {
        val = tcg_const_i64_aarch64(tcg_ctx_00,(long)iVar3);
        do_sat_addsub_vec(s,a->esz,a->rd,a->rn,val,a->u != 0,a->d != 0);
        tcg_temp_free_i64(tcg_ctx_00,val);
      }
    }
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_SINCDEC_v(DisasContext *s, arg_incdec2_cnt *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0) {
        return false;
    }

    unsigned fullsz = vec_full_reg_size(s);
    unsigned numelem = decode_pred_count(fullsz, a->pat, a->esz);
    int inc = numelem * a->imm;

    if (inc != 0) {
        if (sve_access_check(s)) {
            TCGv_i64 t = tcg_const_i64(tcg_ctx, inc);
            do_sat_addsub_vec(s, a->esz, a->rd, a->rn, t, a->u, a->d);
            tcg_temp_free_i64(tcg_ctx, t);
        }
    } else {
        do_mov_z(s, a->rd, a->rn);
    }
    return true;
}